

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

uint16_t udata_getInfoSize_63(UDataInfo *info)

{
  uint16_t x;
  UDataInfo *info_local;
  
  if (info == (UDataInfo *)0x0) {
    info_local._6_2_ = 0;
  }
  else if (info->isBigEndian == '\0') {
    info_local._6_2_ = info->size;
  }
  else {
    info_local._6_2_ = info->size << 8 | info->size >> 8;
  }
  return info_local._6_2_;
}

Assistant:

U_CFUNC uint16_t
udata_getInfoSize(const UDataInfo *info) {
    if(info==NULL) {
        return 0;
    } else if(info->isBigEndian==U_IS_BIG_ENDIAN) {
        /* same endianness */
        return info->size;
    } else {
        /* opposite endianness */
        uint16_t x=info->size;
        return (uint16_t)((x<<8)|(x>>8));
    }
}